

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line<charls::transform_hp3<unsigned_char>::inverse,unsigned_char>
               (quad<unsigned_char> *destination,quad<unsigned_char> *source,size_t pixel_count,
               inverse *transform)

{
  quad<unsigned_char> qVar1;
  size_t i;
  size_t sVar2;
  
  for (sVar2 = 0; pixel_count != sVar2; sVar2 = sVar2 + 1) {
    qVar1.super_triplet<unsigned_char> =
         transform_hp3<unsigned_char>::inverse::operator()
                   (transform,(uint)source[sVar2].super_triplet<unsigned_char>.field_0.v1,
                    (uint)source[sVar2].super_triplet<unsigned_char>.field_1.v2,
                    (uint)source[sVar2].super_triplet<unsigned_char>.field_2.v3);
    qVar1.field_0.v4 = source[sVar2].field_0.v4;
    destination[sVar2] = qVar1;
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = quad<PixelType>(transform(source[i].v1, source[i].v2, source[i].v3), source[i].v4);
    }
}